

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmBinaryReader.cpp
# Opt level: O3

void __thiscall Wasm::WasmBinaryReader::ReadExportSection(WasmBinaryReader *this)

{
  RealCount *pRVar1;
  SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount> *pSVar2;
  FunctionProxy *pFVar3;
  code *pcVar4;
  bool bVar5;
  ExternalKinds kind;
  uint uVar6;
  int iVar7;
  uint index;
  Type funcType;
  uint32 uVar8;
  uint uVar9;
  undefined4 *puVar10;
  Type exportName;
  Type *ppcVar11;
  Type pSVar12;
  WasmGlobal *pWVar13;
  WasmFunctionInfo *pWVar14;
  long lVar15;
  WasmBlock WVar16;
  WasmImport *pWVar17;
  ulong count;
  WebAssemblyModule *this_00;
  WasmBinaryReader *pWVar18;
  undefined1 local_138 [8];
  ArenaAllocator tmpAlloc;
  BaseDictionary<unsigned_int,_SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  exportsNameDict;
  undefined1 local_78 [16];
  undefined1 local_68 [24];
  uint32 local_50;
  uint local_4c;
  uint32 length;
  NameList *list;
  WebAssemblyModule *pWStack_38;
  uint32 nameLength;
  
  pWVar18 = this;
  uVar6 = LEB128<unsigned_int,32u>(this,&local_50);
  local_4c = uVar6;
  if ((100000 < uVar6) && (DAT_015932e2 == '\0')) {
    ThrowDecodingError(pWVar18,L"Too many exports");
  }
  Js::WebAssemblyModule::AllocateFunctionExports(this->m_module,uVar6);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)local_138,
             L"ExportDupCheck",
             &(((((((this->m_module->super_DynamicObject).super_RecyclableObject.type.ptr)->
                  javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
               threadContext->pageAllocator).super_PageAllocator,Js::Throw::OutOfMemory,
             JsUtil::ExternalApi::RecoverUnusedMemory);
  tmpAlloc.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList =
       (void *)0x0;
  if (uVar6 != 0) {
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    local_68._8_8_ = &DAT_015b6718;
    local_68._16_8_ = L"Unknown global %u for export %s";
    uVar6 = 0;
    pWStack_38 = (WebAssemblyModule *)this;
    do {
      exportName = (Type)ReadInlineName((WasmBinaryReader *)pWStack_38,&local_50,
                                        (uint *)((long)&list + 4));
      _length = (SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
      bVar5 = JsUtil::
              BaseDictionary<unsigned_int,_SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::TryGetValue<unsigned_int>
                        ((BaseDictionary<unsigned_int,_SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                          *)&tmpAlloc.
                             super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                             .freeList,(uint *)((long)&list + 4),
                         (SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount> **)&length);
      if (bVar5) {
        count = (ulong)list._4_4_;
        local_78._0_8_ = _length;
        local_78._8_8_ = _length;
        while( true ) {
          if ((SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount> *)local_78._8_8_ ==
              (SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar10 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                               ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar5) goto LAB_00f12509;
            *puVar10 = 0;
          }
          pSVar2 = (SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount> *)
                   (((SListBase<const_char16_t_*,_Memory::ArenaAllocator,_RealCount> *)
                    local_78._8_8_)->super_SListNodeBase<Memory::ArenaAllocator>).next;
          if (pSVar2 == (SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount> *)local_78._0_8_
             ) break;
          local_78._8_8_ = pSVar2;
          ppcVar11 = SListBase<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                               ((Iterator *)local_78);
          iVar7 = PAL_wcsncmp((char16_t *)exportName,*ppcVar11,count);
          if (iVar7 == 0) {
            pWVar18 = (WasmBinaryReader *)local_78;
            SListBase<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                      ((Iterator *)pWVar18);
            ThrowDecodingError(pWVar18,L"Duplicate export name: %s",exportName);
          }
        }
      }
      else {
        _length = (SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount> *)
                  new<Memory::ArenaAllocator>(0x18,(ArenaAllocator *)local_138,0x364470);
        (_length->super_SListBase<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>).
        super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)_length;
        (_length->super_SListBase<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>).
        super_RealCount.count = 0;
        _length->allocator = (ArenaAllocator *)local_138;
        JsUtil::
        BaseDictionary<unsigned_int,SList<char16_t_const*,Memory::ArenaAllocator,RealCount>*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
        ::
        Insert<(JsUtil::BaseDictionary<unsigned_int,SList<char16_t_const*,Memory::ArenaAllocator,RealCount>*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                  ((BaseDictionary<unsigned_int,SList<char16_t_const*,Memory::ArenaAllocator,RealCount>*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                    *)&tmpAlloc.
                       super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                       freeList,(uint *)((long)&list + 4),
                   (SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount> **)&length);
      }
      pSVar2 = _length;
      pSVar12 = (Type)new<Memory::ArenaAllocator>(0x10,_length->allocator,0x364470);
      this_00 = pWStack_38;
      pSVar12[1].next = exportName;
      pSVar12->next =
           (pSVar2->super_SListBase<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>).
           super_SListNodeBase<Memory::ArenaAllocator>.next;
      (pSVar2->super_SListBase<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>).
      super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar12;
      pRVar1 = &(pSVar2->super_SListBase<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>).
                super_RealCount;
      pRVar1->count = pRVar1->count + 1;
      kind = ReadConst<unsigned_char>((WasmBinaryReader *)pWStack_38);
      index = LEB128<unsigned_int,32u>((WasmBinaryReader *)this_00,&local_50);
      switch(kind) {
      case Function:
        funcType = Js::WebAssemblyModule::GetFunctionIndexType
                             ((WebAssemblyModule *)(pWStack_38->m_datasegs).ptr,index);
        pWVar18 = (WasmBinaryReader *)(ulong)(uint)funcType;
        bVar5 = FunctionIndexTypes::CanBeExported(funcType);
        if (!bVar5) {
          ThrowDecodingError(pWVar18,L"Invalid Export %u => func[%u]",(ulong)uVar6,(ulong)index);
        }
        Js::WebAssemblyModule::SetExport
                  ((WebAssemblyModule *)(pWStack_38->m_datasegs).ptr,uVar6,index,
                   (char16 *)exportName,list._4_4_,Function);
        if (funcType == ImportThunk) {
          pWVar14 = Js::WebAssemblyModule::GetWasmFunctionInfo
                              ((WebAssemblyModule *)(pWStack_38->m_datasegs).ptr,index);
          local_68._0_8_ = pWVar14->importedFunctionReference;
          pFVar3 = (FunctionProxy *)(pWStack_38->m_memImport).ptr;
          if (pFVar3 == (FunctionProxy *)0x0 || pWStack_38->m_importedFunctionCount != 1) {
            bVar5 = Js::Phases::IsEnabled((Phases *)local_68._8_8_,WasmReaderPhase);
          }
          else {
            uVar9 = Js::FunctionProxy::GetSourceContextId(pFVar3);
            if (pWStack_38->m_importedFunctionCount == 1) {
              pWVar17 = (pWStack_38->m_memImport).ptr;
            }
            else {
              pWVar17 = (WasmImport *)0x0;
            }
            lVar15 = *(long *)&pWVar17->importNameLen;
            if (lVar15 == 0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar10 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/../Runtime/Base/FunctionBody.h"
                                 ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
              if (!bVar5) goto LAB_00f12509;
              *puVar10 = 0;
              lVar15 = *(long *)&pWVar17->importNameLen;
            }
            bVar5 = Js::Phases::IsEnabled
                              ((Phases *)local_68._8_8_,WasmReaderPhase,uVar9,
                               *(LocalFunctionId *)(lVar15 + 0x10));
          }
          if (bVar5 != false) {
            Output::Print(L"Export #%u: Import(%s.%s)(%u) => %s",(ulong)uVar6,
                          *(char16 **)(local_68._0_8_ + 8),*(char16 **)(local_68._0_8_ + 0x18),
                          (ulong)index);
            Output::Print(L"\n");
            Output::Flush();
          }
        }
        else {
          pFVar3 = (FunctionProxy *)(pWStack_38->m_memImport).ptr;
          if (pFVar3 == (FunctionProxy *)0x0 || pWStack_38->m_importedFunctionCount != 1) {
            bVar5 = Js::Phases::IsEnabled((Phases *)local_68._8_8_,WasmReaderPhase);
          }
          else {
            uVar9 = Js::FunctionProxy::GetSourceContextId(pFVar3);
            if (pWStack_38->m_importedFunctionCount == 1) {
              WVar16 = (WasmBlock)(pWStack_38->m_memImport).ptr;
            }
            else {
              WVar16.isSingleResult = false;
              WVar16._1_3_ = 0;
              WVar16.field_1 = (anon_union_4_2_52a1cc71_for_WasmBlock_1)0x0;
            }
            lVar15 = *(long *)((long)WVar16 + 0x10);
            if (lVar15 == 0) {
              AssertCount = AssertCount + 1;
              local_68._0_8_ = WVar16;
              Js::Throw::LogAssert();
              *puVar10 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/../Runtime/Base/FunctionBody.h"
                                 ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
              if (!bVar5) {
LAB_00f12509:
                pcVar4 = (code *)invalidInstructionException();
                (*pcVar4)();
              }
              *puVar10 = 0;
              lVar15 = *(long *)(local_68._0_8_ + 0x10);
            }
            bVar5 = Js::Phases::IsEnabled
                              ((Phases *)local_68._8_8_,WasmReaderPhase,uVar9,
                               *(LocalFunctionId *)(lVar15 + 0x10));
          }
          if (bVar5 != false) {
            Output::Print(L"Export #%u: Function(%u) => %s",(ulong)uVar6,(ulong)index,exportName);
            Output::Print(L"\n");
            Output::Flush();
          }
        }
        goto LAB_00f122ca;
      case Table:
        if (index != 0) {
          local_68._16_8_ = L"Unknown table index %u for export %s";
          goto LAB_00f1254c;
        }
        break;
      case Memory:
        if (index != 0) {
          local_68._16_8_ = L"Unknown memory index %u for export %s";
          goto LAB_00f1254c;
        }
        break;
      case Global:
        this_00 = (WebAssemblyModule *)(pWStack_38->m_datasegs).ptr;
        uVar8 = Js::WebAssemblyModule::GetGlobalCount(this_00);
        if (uVar8 <= index) {
LAB_00f1254c:
          ThrowDecodingError((WasmBinaryReader *)this_00,(char16 *)local_68._16_8_,(ulong)index,
                             exportName);
        }
        this_00 = (WebAssemblyModule *)(pWStack_38->m_datasegs).ptr;
        pWVar13 = Js::WebAssemblyModule::GetGlobal(this_00,index);
        if (pWVar13->m_isMutable != false) {
          local_68._16_8_ = L"Mutable globals cannot be exported";
          goto LAB_00f1254c;
        }
        goto LAB_00f122ab;
      default:
        ThrowDecodingError((WasmBinaryReader *)this_00,L"Exported Kind %d, NYI",(ulong)kind);
      }
      index = 0;
LAB_00f122ab:
      Js::WebAssemblyModule::SetExport
                ((WebAssemblyModule *)(pWStack_38->m_datasegs).ptr,uVar6,index,(char16 *)exportName,
                 list._4_4_,kind);
LAB_00f122ca:
      uVar6 = uVar6 + 1;
    } while (uVar6 != local_4c);
  }
  JsUtil::
  BaseDictionary<unsigned_int,_SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::~BaseDictionary((BaseDictionary<unsigned_int,_SList<const_char16_t_*,_Memory::ArenaAllocator,_RealCount>_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                     *)&tmpAlloc.
                        super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                        freeList);
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::~ArenaAllocatorBase
            ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)local_138);
  return;
}

Assistant:

void WasmBinaryReader::ReadExportSection()
{
    uint32 length;
    uint32 numExports = LEB128(length);
    if (numExports > Limits::GetMaxExports())
    {
        ThrowDecodingError(_u("Too many exports"));
    }

    m_module->AllocateFunctionExports(numExports);

    ArenaAllocator tmpAlloc(_u("ExportDupCheck"), m_module->GetScriptContext()->GetThreadContext()->GetPageAllocator(), Js::Throw::OutOfMemory);
    typedef SList<const char16*> NameList;
    JsUtil::BaseDictionary<uint32, NameList*, ArenaAllocator> exportsNameDict(&tmpAlloc);

    for (uint32 iExport = 0; iExport < numExports; iExport++)
    {
        uint32 nameLength;
        const char16* exportName = ReadInlineName(length, nameLength);

        // Check if the name is already used
        NameList* list = nullptr;
        if (exportsNameDict.TryGetValue(nameLength, &list))
        {
            const char16** found = list->Find([exportName, nameLength](const char16* existing) { 
                return wcsncmp(exportName, existing, nameLength) == 0;
            });
            if (found)
            {
                ThrowDecodingError(_u("Duplicate export name: %s"), exportName);
            }
        }
        else
        {
            list = Anew(&tmpAlloc, NameList, &tmpAlloc);
            exportsNameDict.Add(nameLength, list);
        }
        list->Push(exportName);

        ExternalKinds kind = ReadExternalKind();
        uint32 index = LEB128(length);
        switch (kind)
        {
        case ExternalKinds::Function:
        {
            FunctionIndexTypes::Type type = m_module->GetFunctionIndexType(index);
            if (!FunctionIndexTypes::CanBeExported(type))
            {
                ThrowDecodingError(_u("Invalid Export %u => func[%u]"), iExport, index);
            }
            m_module->SetExport(iExport, index, exportName, nameLength, kind);

#if DBG_DUMP
            if (type == FunctionIndexTypes::ImportThunk)
            {
                WasmImport* import = m_module->GetWasmFunctionInfo(index)->importedFunctionReference;
                TRACE_WASM_DECODER(_u("Export #%u: Import(%s.%s)(%u) => %s"), iExport, import->modName, import->importName, index, exportName);
            }
            else
            {
                TRACE_WASM_DECODER(_u("Export #%u: Function(%u) => %s"), iExport, index, exportName);
            }
#endif
            break;
        }
        case ExternalKinds::Memory:
            if (index != 0)
            {
                ThrowDecodingError(_u("Unknown memory index %u for export %s"), index, exportName);
            }
            m_module->SetExport(iExport, index, exportName, nameLength, kind);
            break;
        case ExternalKinds::Table:
            if (index != 0)
            {
                ThrowDecodingError(_u("Unknown table index %u for export %s"), index, exportName);
            }
            m_module->SetExport(iExport, index, exportName, nameLength, kind);
            break;
        case ExternalKinds::Global:
            if (index >= m_module->GetGlobalCount())
            {
                ThrowDecodingError(_u("Unknown global %u for export %s"), index, exportName);
            }
            if (m_module->GetGlobal(index)->IsMutable())
            {
                ThrowDecodingError(_u("Mutable globals cannot be exported"), index, exportName);
            }
            m_module->SetExport(iExport, index, exportName, nameLength, kind);
            break;
        default:
            ThrowDecodingError(_u("Exported Kind %d, NYI"), kind);
            break;
        }

    }
}